

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

int lua_yieldk(lua_State *L,int nresults,lua_KContext ctx,lua_KFunction k)

{
  CallInfo *pCVar1;
  CallInfo *ci;
  lua_KFunction k_local;
  lua_KContext ctx_local;
  int nresults_local;
  lua_State *L_local;
  
  pCVar1 = L->ci;
  if ((L->nCcalls & 0xffff0000) == 0) {
    L->status = '\x01';
    (pCVar1->u2).funcidx = nresults;
    if ((pCVar1->callstatus & 2) == 0) {
      return 0;
    }
    (pCVar1->u).c.k = k;
    if (k != (lua_KFunction)0x0) {
      (pCVar1->u).c.ctx = ctx;
    }
    luaD_throw(L,1);
  }
  if (L != L->l_G->mainthread) {
    luaG_runerror(L,"attempt to yield across a C-call boundary");
  }
  luaG_runerror(L,"attempt to yield from outside a coroutine");
}

Assistant:

LUA_API int lua_yieldk (lua_State *L, int nresults, lua_KContext ctx,
                        lua_KFunction k) {
  CallInfo *ci;
  luai_userstateyield(L, nresults);
  lua_lock(L);
  ci = L->ci;
  api_checknelems(L, nresults);
  if (l_unlikely(!yieldable(L))) {
    if (L != G(L)->mainthread)
      luaG_runerror(L, "attempt to yield across a C-call boundary");
    else
      luaG_runerror(L, "attempt to yield from outside a coroutine");
  }
  L->status = LUA_YIELD;
  ci->u2.nyield = nresults;  /* save number of results */
  if (isLua(ci)) {  /* inside a hook? */
    lua_assert(!isLuacode(ci));
    api_check(L, nresults == 0, "hooks cannot yield values");
    api_check(L, k == NULL, "hooks cannot continue after yielding");
  }
  else {
    if ((ci->u.c.k = k) != NULL)  /* is there a continuation? */
      ci->u.c.ctx = ctx;  /* save context */
    luaD_throw(L, LUA_YIELD);
  }
  lua_assert(ci->callstatus & CIST_HOOKED);  /* must be inside a hook */
  lua_unlock(L);
  return 0;  /* return to 'luaD_hook' */
}